

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_sha256sum(uchar *tmp,size_t tmplen,uchar *sha256sum,size_t unused)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  uint local_3c;
  EVP_MD_CTX *pEStack_38;
  uint len;
  EVP_MD_CTX *mdctx;
  size_t unused_local;
  uchar *sha256sum_local;
  size_t tmplen_local;
  uchar *tmp_local;
  
  local_3c = 0;
  mdctx = (EVP_MD_CTX *)unused;
  unused_local = (size_t)sha256sum;
  sha256sum_local = (uchar *)tmplen;
  tmplen_local = (size_t)tmp;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    tmp_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pEStack_38 = ctx;
    type = EVP_sha256();
    iVar1 = EVP_DigestInit(ctx,type);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(pEStack_38);
      tmp_local._4_4_ = CURLE_FAILED_INIT;
    }
    else {
      EVP_DigestUpdate(pEStack_38,(void *)tmplen_local,(size_t)sha256sum_local);
      EVP_DigestFinal_ex(pEStack_38,(uchar *)unused_local,&local_3c);
      EVP_MD_CTX_free(pEStack_38);
      tmp_local._4_4_ = CURLE_OK;
    }
  }
  return tmp_local._4_4_;
}

Assistant:

static CURLcode ossl_sha256sum(const unsigned char *tmp, /* input */
                               size_t tmplen,
                               unsigned char *sha256sum /* output */,
                               size_t unused)
{
  EVP_MD_CTX *mdctx;
  unsigned int len = 0;
  (void) unused;

  mdctx = EVP_MD_CTX_create();
  if(!mdctx)
    return CURLE_OUT_OF_MEMORY;
  if(!EVP_DigestInit(mdctx, EVP_sha256())) {
    EVP_MD_CTX_destroy(mdctx);
    return CURLE_FAILED_INIT;
  }
  EVP_DigestUpdate(mdctx, tmp, tmplen);
  EVP_DigestFinal_ex(mdctx, sha256sum, &len);
  EVP_MD_CTX_destroy(mdctx);
  return CURLE_OK;
}